

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O0

int32_t __thiscall icu_63::KeywordEnumeration::count(KeywordEnumeration *this,UErrorCode *param_1)

{
  size_t sVar1;
  int local_24;
  char *pcStack_20;
  int32_t result;
  char *kw;
  UErrorCode *param_1_local;
  KeywordEnumeration *this_local;
  
  pcStack_20 = this->keywords;
  local_24 = 0;
  for (; *pcStack_20 != '\0'; pcStack_20 = pcStack_20 + sVar1 + 1) {
    local_24 = local_24 + 1;
    sVar1 = strlen(pcStack_20);
  }
  return local_24;
}

Assistant:

virtual int32_t count(UErrorCode &/*status*/) const {
        char *kw = keywords;
        int32_t result = 0;
        while(*kw) {
            result++;
            kw += uprv_strlen(kw)+1;
        }
        return result;
    }